

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void updateHashChain(Hash *hash,size_t wpos,uint hashval,unsigned_short numzeros)

{
  int *piVar1;
  
  hash->val[wpos] = hashval;
  piVar1 = hash->head;
  if (piVar1[hashval] != -1) {
    hash->chain[wpos] = (unsigned_short)piVar1[hashval];
    piVar1 = hash->head;
  }
  piVar1[hashval] = (int)wpos;
  hash->zeros[wpos] = numzeros;
  piVar1 = hash->headz;
  if (piVar1[numzeros] != -1) {
    hash->chainz[wpos] = (unsigned_short)piVar1[numzeros];
    piVar1 = hash->headz;
  }
  piVar1[numzeros] = (int)wpos;
  return;
}

Assistant:

static void updateHashChain(Hash* hash, size_t wpos, unsigned hashval, unsigned short numzeros)
{
	hash->val[wpos] = (int)hashval;
	if (hash->head[hashval] != -1) hash->chain[wpos] = hash->head[hashval];
	hash->head[hashval] = wpos;

	hash->zeros[wpos] = numzeros;
	if (hash->headz[numzeros] != -1) hash->chainz[wpos] = hash->headz[numzeros];
	hash->headz[numzeros] = wpos;
}